

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_reader_extract_iter_free(mz_zip_reader_extract_iter_state *pState)

{
  mz_zip_internal_state *pmVar1;
  mz_zip_archive *pmVar2;
  mz_zip_error mVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (((pState != (mz_zip_reader_extract_iter_state *)0x0) &&
      (pmVar2 = pState->pZip, pmVar2 != (mz_zip_archive *)0x0)) &&
     (pmVar1 = pmVar2->m_pState, pmVar1 != (mz_zip_internal_state *)0x0)) {
    if (((pState->status == 0) && ((pState->flags & 0x400) == 0)) &&
       ((mVar3 = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE,
        pState->out_buf_ofs != (pState->file_stat).m_uncomp_size ||
        (mVar3 = MZ_ZIP_DECOMPRESSION_FAILED, pState->file_crc32 != (pState->file_stat).m_crc32))))
    {
      pmVar2->m_last_error = mVar3;
      pState->status = -1;
    }
    if (pmVar1->m_pMem == (void *)0x0) {
      (*pmVar2->m_pFree)(pmVar2->m_pAlloc_opaque,pState->pRead_buf);
      pmVar2 = pState->pZip;
    }
    if (pState->pWrite_buf != (void *)0x0) {
      (*pmVar2->m_pFree)(pmVar2->m_pAlloc_opaque,pState->pWrite_buf);
      pmVar2 = pState->pZip;
    }
    uVar4 = (uint)(pState->status == 0);
    (*pmVar2->m_pFree)(pmVar2->m_pAlloc_opaque,pState);
  }
  return uVar4;
}

Assistant:

mz_bool mz_zip_reader_extract_iter_free(mz_zip_reader_extract_iter_state* pState)
{
    int status;

    /* Argument sanity check */
    if ((!pState) || (!pState->pZip) || (!pState->pZip->m_pState))
        return MZ_FALSE;

    /* Was decompression completed and requested? */
    if ((pState->status == TINFL_STATUS_DONE) && (!(pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
    {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (pState->out_buf_ofs != pState->file_stat.m_uncomp_size)
        {
            mz_zip_set_error(pState->pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            pState->status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (pState->file_crc32 != pState->file_stat.m_crc32)
        {
            mz_zip_set_error(pState->pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            pState->status = TINFL_STATUS_FAILED;
        }
#endif
    }

    /* Free buffers */
    if (!pState->pZip->m_pState->m_pMem)
        pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState->pRead_buf);
    if (pState->pWrite_buf)
        pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState->pWrite_buf);

    /* Save status */
    status = pState->status;

    /* Free context */
    pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState);

    return status == TINFL_STATUS_DONE;
}